

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_all(lyd_node **tree,ly_ctx *ctx,uint32_t val_opts,lyd_node **diff)

{
  ly_ctx *plVar1;
  ly_ctx *local_58;
  ly_ctx *local_50;
  ly_ctx *local_48;
  ly_ctx *local_40;
  ly_ctx *local_38;
  lyd_node **diff_local;
  ly_ctx *plStack_20;
  uint32_t val_opts_local;
  ly_ctx *ctx_local;
  lyd_node **tree_local;
  
  if (tree == (lyd_node **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","tree","lyd_validate_all")
    ;
    tree_local._4_4_ = LY_EINVAL;
  }
  else if ((*tree == (lyd_node *)0x0) && (ctx == (ly_ctx *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","*tree || ctx",
           "lyd_validate_all");
    tree_local._4_4_ = LY_EINVAL;
  }
  else {
    if (*tree != (lyd_node *)0x0) {
      if ((*tree)->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)(*tree)[2].schema;
      }
      else {
        plVar1 = (*tree)->schema->module->ctx;
      }
      if ((plVar1 != (ly_ctx *)0x0) && (ctx != (ly_ctx *)0x0)) {
        if (*tree == (lyd_node *)0x0) {
          local_40 = (ly_ctx *)0x0;
        }
        else {
          if ((*tree)->schema == (lysc_node *)0x0) {
            local_38 = (ly_ctx *)(*tree)[2].schema;
          }
          else {
            local_38 = (*tree)->schema->module->ctx;
          }
          local_40 = local_38;
        }
        if (local_40 != ctx) {
          if (*tree == (lyd_node *)0x0) {
            local_50 = (ly_ctx *)0x0;
          }
          else {
            if ((*tree)->schema == (lysc_node *)0x0) {
              local_48 = (ly_ctx *)(*tree)[2].schema;
            }
            else {
              local_48 = (*tree)->schema->module->ctx;
            }
            local_50 = local_48;
          }
          ly_log(local_50,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    plStack_20 = ctx;
    if (ctx == (ly_ctx *)0x0) {
      if ((*tree)->schema == (lysc_node *)0x0) {
        local_58 = (ly_ctx *)(*tree)[2].schema;
      }
      else {
        local_58 = (*tree)->schema->module->ctx;
      }
      plStack_20 = local_58;
    }
    if (diff != (lyd_node **)0x0) {
      *diff = (lyd_node *)0x0;
    }
    tree_local._4_4_ =
         lyd_validate(tree,(lys_module *)0x0,plStack_20,val_opts,'\x01',(ly_set *)0x0,(ly_set *)0x0,
                      (ly_set *)0x0,(ly_set *)0x0,(ly_set *)0x0,diff);
  }
  return tree_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_validate_all(struct lyd_node **tree, const struct ly_ctx *ctx, uint32_t val_opts, struct lyd_node **diff)
{
    LY_CHECK_ARG_RET(NULL, tree, *tree || ctx, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(*tree ? LYD_CTX(*tree) : NULL, ctx, LY_EINVAL);
    if (!ctx) {
        ctx = LYD_CTX(*tree);
    }
    if (diff) {
        *diff = NULL;
    }

    return lyd_validate(tree, NULL, ctx, val_opts, 1, NULL, NULL, NULL, NULL, NULL, diff);
}